

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

NondegeneracyCheckResult * __thiscall
slang::ast::AssertionExpr::checkNondegeneracy
          (NondegeneracyCheckResult *__return_storage_ptr__,AssertionExpr *this)

{
  NondegeneracyCheckResult *pNVar1;
  
  pNVar1 = (NondegeneracyCheckResult *)
           (*(code *)(&DAT_0041f8cc + *(int *)(&DAT_0041f8cc + (ulong)this->kind * 4)))();
  return pNVar1;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult AssertionExpr::checkNondegeneracy() const {
    NondegeneracyCheckVisitor visitor;
    return visit(visitor);
}